

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O0

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
          (linear_node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *db,
          size_t key)

{
  bool bVar1;
  const_iterator paVar2;
  database_reader *archive;
  index_pointer local_c0;
  uint local_b8;
  value_type local_a8;
  index_pointer local_a0;
  value_type local_98;
  database_reader local_90;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> existing_key;
  address *child;
  const_iterator __end3;
  const_iterator __begin3;
  linear_node *__range3;
  size_t cnum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  database *db_local;
  linear_node *this_local;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> local_18;
  
  __range3 = (linear_node *)0x0;
  cnum = key;
  key_local = db;
  db_local = (database *)this;
  __end3 = begin(this);
  paVar2 = end(this);
  while( true ) {
    if (__end3 == paVar2) {
      index_pointer::index_pointer((index_pointer *)&local_c0.addr_);
      std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_true>(&local_18,&local_c0,&not_found);
      return local_18;
    }
    existing_key.field_2._8_8_ = __end3;
    local_98 = __end3->a_;
    serialize::archive::database_reader::database_reader
              (&local_90,(database *)key_local,(address)local_98);
    serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               (serialize *)&local_90,archive);
    bVar1 = std::
            equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&this_local + 7),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)cnum);
    if (bVar1) {
      local_a8 = *(value_type *)existing_key.field_2._8_8_;
      index_pointer::index_pointer((index_pointer *)&local_a0.addr_,(address)local_a8);
      std::pair<const_pstore::index::details::index_pointer,_unsigned_long>::
      pair<pstore::index::details::index_pointer,_unsigned_long_&,_true>
                (&local_18,&local_a0,(unsigned_long *)&__range3);
    }
    else {
      __range3 = (linear_node *)((__range3->signature_)._M_elems + 1);
    }
    local_b8 = (uint)bVar1;
    std::__cxx11::string::~string((string *)local_80);
    if (local_b8 != 0) break;
    __end3 = __end3 + 1;
  }
  return local_18;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }